

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O3

void __thiscall TPZFront<float>::~TPZFront(TPZFront<float> *this,void **vtt)

{
  float *pfVar1;
  long *plVar2;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  (this->fData)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  pfVar1 = (this->fData).fStore;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  TPZManVector<int,_10>::~TPZManVector(&(this->fFree).super_TPZManVector<int,_10>);
  (this->fLocal)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  plVar2 = (this->fLocal).fStore;
  if (plVar2 != (long *)0x0) {
    operator_delete__(plVar2);
  }
  TPZManVector<long,_10>::~TPZManVector(&this->fGlobal);
  return;
}

Assistant:

TPZFront<TVar>::~TPZFront(){
}